

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Serialize<ParamsStream<SizeComputer&,TransactionSerParams>,28u,unsigned_char>
               (ParamsStream<SizeComputer_&,_TransactionSerParams> *os,
               prevector<28U,_unsigned_char,_unsigned_int,_int> *v)

{
  long lVar1;
  bool bVar2;
  size_t in_RCX;
  ParamsStream<SizeComputer_&,_TransactionSerParams> *in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffc8;
  ParamsStream<SizeComputer_&,_TransactionSerParams> *nSize;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffd8;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nSize = in_RDI;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_stack_ffffffffffffffd8);
  WriteCompactSize<ParamsStream<SizeComputer&,TransactionSerParams>>
            ((ParamsStream<SizeComputer_&,_TransactionSerParams> *)in_stack_ffffffffffffffd8,
             (uint64_t)nSize);
  bVar2 = prevector<28U,_unsigned_char,_unsigned_int,_int>::empty(in_stack_ffffffffffffffc8);
  if (!bVar2) {
    SVar3 = MakeByteSpan<prevector<28u,unsigned_char,unsigned_int,int>const&>
                      (in_stack_ffffffffffffffd8);
    local_20 = (void *)SVar3.m_size;
    ParamsStream<SizeComputer_&,_TransactionSerParams>::write
              (in_RDI,(int)SVar3.m_data,local_20,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const prevector<N, T>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}